

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_time.cpp
# Opt level: O0

void sc_core::sc_set_default_time_unit(double v,sc_time_unit tu)

{
  sc_time_params *psVar1;
  bool bVar2;
  sc_simcontext *psVar3;
  sc_simcontext *simc_p;
  uint in_EDI;
  double in_XMM0_Qa;
  double dVar4;
  double time_unit;
  sc_time_params *time_params;
  sc_simcontext *simc;
  double dummy;
  int in_stack_00000044;
  char *in_stack_00000048;
  char *in_stack_00000050;
  char *in_stack_00000058;
  sc_severity in_stack_00000064;
  double local_18;
  uint local_c;
  double local_8;
  
  local_c = in_EDI;
  local_8 = in_XMM0_Qa;
  if (sc_set_default_time_unit::warn_default_time_unit) {
    sc_set_default_time_unit::warn_default_time_unit = false;
    sc_report_handler::report
              (in_stack_00000064,in_stack_00000058,in_stack_00000050,in_stack_00000048,
               in_stack_00000044);
  }
  if (local_8 < 0.0) {
    sc_report_handler::report
              (in_stack_00000064,in_stack_00000058,in_stack_00000050,in_stack_00000048,
               in_stack_00000044);
  }
  dVar4 = log10(local_8);
  dVar4 = modf(dVar4,&local_18);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    sc_report_handler::report
              (in_stack_00000064,in_stack_00000058,in_stack_00000050,in_stack_00000048,
               in_stack_00000044);
  }
  psVar3 = sc_get_curr_simcontext();
  simc_p = sc_get_curr_simcontext();
  bVar2 = sc_is_running(simc_p);
  if (bVar2) {
    sc_report_handler::report
              (in_stack_00000064,in_stack_00000058,in_stack_00000050,in_stack_00000048,
               in_stack_00000044);
  }
  psVar1 = psVar3->m_time_params;
  if ((psVar1->time_resolution_fixed & 1U) != 0) {
    sc_report_handler::report
              (in_stack_00000064,in_stack_00000058,in_stack_00000050,in_stack_00000048,
               in_stack_00000044);
  }
  if ((psVar1->default_time_unit_specified & 1U) != 0) {
    sc_report_handler::report
              (in_stack_00000064,in_stack_00000058,in_stack_00000050,in_stack_00000048,
               in_stack_00000044);
  }
  dVar4 = (local_8 * *(double *)(time_values + (ulong)local_c * 8)) / psVar1->time_resolution;
  if (dVar4 < 1.0) {
    sc_report_handler::report
              (in_stack_00000064,in_stack_00000058,in_stack_00000050,in_stack_00000048,
               in_stack_00000044);
  }
  psVar1->default_time_unit = (long)dVar4;
  psVar1->default_time_unit_specified = true;
  return;
}

Assistant:

void
sc_set_default_time_unit( double v, sc_time_unit tu )
{
    static bool warn_default_time_unit=true;
    if ( warn_default_time_unit )
    {
        warn_default_time_unit=false;
        SC_REPORT_INFO(SC_ID_IEEE_1666_DEPRECATION_,
	    "deprecated function: sc_set_default_time_unit");
    }

    // first perform the necessary checks

    // must be positive
    if( v < 0.0 ) {
	SC_REPORT_ERROR( SC_ID_SET_DEFAULT_TIME_UNIT_, "value not positive" );
    }

    // must be a power of ten
    double dummy;
    if( modf( log10( v ), &dummy ) != 0.0 ) {
	SC_REPORT_ERROR( SC_ID_SET_DEFAULT_TIME_UNIT_,
			 "value not a power of ten" );
    }

    sc_simcontext* simc = sc_get_curr_simcontext();

    // can only be specified during elaboration
    if( sc_is_running() ) {
	SC_REPORT_ERROR( SC_ID_SET_DEFAULT_TIME_UNIT_, "simulation running" );
    }

    sc_time_params* time_params = simc->m_time_params;

    // can only be specified before any sc_time is constructed
    if( time_params->time_resolution_fixed ) {
        SC_REPORT_ERROR( SC_ID_SET_DEFAULT_TIME_UNIT_,
                         "sc_time object(s) constructed" );
    }

    // can be specified only once
    if( time_params->default_time_unit_specified ) {
	SC_REPORT_ERROR( SC_ID_SET_DEFAULT_TIME_UNIT_, "already specified" );
    }

    // must be larger than or equal to the time resolution
    volatile double time_unit = ( v * time_values[tu] ) /
	                        time_params->time_resolution;
    if( time_unit < 1.0 ) {
	SC_REPORT_ERROR( SC_ID_SET_DEFAULT_TIME_UNIT_,
			 "value smaller than time resolution" );
    }

    time_params->default_time_unit = static_cast<sc_dt::int64>( time_unit );
    time_params->default_time_unit_specified = true;
}